

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_Header(archive_read *a,_7z_header_info *h,int check_header_id)

{
  long lVar1;
  uint64_t uVar2;
  size_t sVar3;
  int iVar4;
  uint32_t uVar5;
  void *pvVar6;
  uchar *puVar7;
  long lVar8;
  long *plVar9;
  bool bVar10;
  int dir;
  int allAreDefined;
  size_t b;
  size_t nb;
  size_t nl;
  uchar *np;
  size_t ll;
  uint64_t size_1;
  int type;
  uint64_t size;
  int sindex;
  int empty_streams;
  int eindex;
  uint i;
  uint32_t indexInFolder;
  uint32_t folderIndex;
  _7zip_entry *entries;
  _7z_stream_info *si;
  _7z_folder *folders;
  uchar *p;
  _7zip *zip;
  _7z_header_info *p_Stack_20;
  int check_header_id_local;
  _7z_header_info *h_local;
  archive_read *a_local;
  
  entries = (_7zip_entry *)a->format->data;
  p = (uchar *)entries;
  zip._4_4_ = check_header_id;
  p_Stack_20 = h;
  h_local = (_7z_header_info *)a;
  if (check_header_id != 0) {
    folders = (_7z_folder *)header_bytes(a,1);
    if (folders == (_7z_folder *)0x0) {
      return -1;
    }
    if ((uchar)folders->numCoders != '\x01') {
      return -1;
    }
  }
  folders = (_7z_folder *)header_bytes((archive_read *)h_local,1);
  if (folders == (_7z_folder *)0x0) {
    a_local._4_4_ = -1;
  }
  else if ((uchar)folders->numCoders == '\x02') {
    do {
      folders = (_7z_folder *)header_bytes((archive_read *)h_local,1);
      if (folders == (_7z_folder *)0x0) {
        return -1;
      }
      if ((uchar)folders->numCoders == '\0') {
        folders = (_7z_folder *)header_bytes((archive_read *)h_local,1);
        if (folders == (_7z_folder *)0x0) {
          return -1;
        }
        goto LAB_001b5a9e;
      }
      iVar4 = parse_7zip_uint64((archive_read *)h_local,(uint64_t *)&stack0xffffffffffffff90);
    } while (-1 < iVar4);
    a_local._4_4_ = -1;
  }
  else {
LAB_001b5a9e:
    if ((char)folders->numCoders == '\x04') {
      iVar4 = read_StreamsInfo((archive_read *)h_local,(_7z_stream_info *)p);
      if (iVar4 < 0) {
        return -1;
      }
      folders = (_7z_folder *)header_bytes((archive_read *)h_local,1);
      if (folders == (_7z_folder *)0x0) {
        return -1;
      }
    }
    if ((char)folders->numCoders == '\0') {
      a_local._4_4_ = 0;
    }
    else if ((char)folders->numCoders == '\x05') {
      iVar4 = parse_7zip_uint64((archive_read *)h_local,(uint64_t *)(p + 0x98));
      if (iVar4 < 0) {
        a_local._4_4_ = -1;
      }
      else if (*(ulong *)(p + 0x98) < 0x5f5e101) {
        pvVar6 = calloc(*(size_t *)(p + 0x98),0x50);
        *(void **)(p + 0xa0) = pvVar6;
        if (*(long *)(p + 0xa0) == 0) {
          a_local._4_4_ = -1;
        }
        else {
          _indexInFolder = *(long *)(p + 0xa0);
          size._4_4_ = 0;
LAB_001b5bb4:
          do {
            folders = (_7z_folder *)header_bytes((archive_read *)h_local,1);
            if (folders == (_7z_folder *)0x0) {
              return -1;
            }
            size_1._4_4_ = (uint)(byte)folders->numCoders;
            if (size_1._4_4_ == 0) {
              lVar1 = *(long *)&entries->mtime_ns;
              size._0_4_ = 0;
              sindex = 0;
              eindex = 0;
              i = 0;
              empty_streams = 0;
              do {
                if (*(ulong *)(p + 0x98) <= (ulong)(uint)empty_streams) {
                  return 0;
                }
                if ((p_Stack_20->emptyStreamBools == (uchar *)0x0) ||
                   (p_Stack_20->emptyStreamBools[(uint)empty_streams] == '\0')) {
                  lVar8 = _indexInFolder + (ulong)(uint)empty_streams * 0x50;
                  *(uint *)(lVar8 + 0x18) = *(uint *)(lVar8 + 0x18) | 0x10;
                }
                *(uint *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x44) =
                     *(uint *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x48) >> 0x10;
                if ((*(uint *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x48) & 0x8000)
                    == 0) {
                  if ((*(uint *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x48) & 0x10)
                      == 0) {
                    if ((*(uint *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x48) & 1)
                        == 0) {
                      *(undefined4 *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x44) =
                           0x81a4;
                    }
                    else {
                      *(undefined4 *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x44) =
                           0x8124;
                    }
                  }
                  else if ((*(uint *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x48) & 1
                           ) == 0) {
                    *(undefined4 *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x44) =
                         0x41ed;
                  }
                  else {
                    *(undefined4 *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x44) =
                         0x416d;
                  }
                }
                if ((*(uint *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x18) & 0x10) ==
                    0) {
                  if (p_Stack_20->emptyFileBools == (uchar *)0x0) {
                    bVar10 = true;
                  }
                  else {
                    bVar10 = p_Stack_20->emptyFileBools[sindex] == '\0';
                    sindex = sindex + 1;
                  }
                  if (*(int *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x44) == 0) {
                    if (bVar10) {
                      *(undefined4 *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x44) =
                           0x41ff;
                    }
                    else {
                      *(undefined4 *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x44) =
                           0x81b6;
                    }
                  }
                  else if ((bVar10) &&
                          ((*(uint *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x44) &
                           0xf000) != 0x4000)) {
                    lVar8 = _indexInFolder + (ulong)(uint)empty_streams * 0x50;
                    *(uint *)(lVar8 + 0x44) = *(uint *)(lVar8 + 0x44) & 0xffff0fff;
                    lVar8 = _indexInFolder + (ulong)(uint)empty_streams * 0x50;
                    *(uint *)(lVar8 + 0x44) = *(uint *)(lVar8 + 0x44) | 0x4000;
                  }
                  if ((((*(uint *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x44) &
                        0xf000) == 0x4000) &&
                      (1 < *(ulong *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50))) &&
                     ((*(char *)(*(long *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 8) +
                                *(long *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50) + -2)
                       != '/' ||
                      (*(char *)(*(long *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 8) +
                                *(long *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50) + -1)
                       != '\0')))) {
                    *(undefined1 *)
                     (*(long *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 8) +
                     *(long *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50)) = 0x2f;
                    *(undefined1 *)
                     (*(long *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 8) + 1 +
                     *(long *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50)) = 0;
                    plVar9 = (long *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50);
                    *plVar9 = *plVar9 + 2;
                  }
                  *(undefined4 *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x14) =
                       0xffffffff;
                }
                else {
                  if (*(ulong *)&entries->attr <= (ulong)(long)(int)size) {
                    return -1;
                  }
                  if (*(int *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x44) == 0) {
                    *(undefined4 *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x44) =
                         0x81b6;
                  }
                  if (entries[1].utf16name[(int)size] != '\0') {
                    lVar8 = _indexInFolder + (ulong)(uint)empty_streams * 0x50;
                    *(uint *)(lVar8 + 0x18) = *(uint *)(lVar8 + 0x18) | 8;
                  }
                  *(int *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x14) = (int)size;
                  size._0_4_ = (int)size + 1;
                }
                if ((*(uint *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x48) & 1) != 0)
                {
                  lVar8 = _indexInFolder + (ulong)(uint)empty_streams * 0x50;
                  *(uint *)(lVar8 + 0x44) = *(uint *)(lVar8 + 0x44) & 0xffffff6d;
                }
                if (((*(uint *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x18) & 0x10)
                     == 0) && (eindex == 0)) {
                  *(undefined4 *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x10) =
                       0xffffffff;
                }
                else {
                  if (eindex == 0) {
                    while( true ) {
                      if ((ulong)entries->ctime <= (ulong)i) {
                        return -1;
                      }
                      if (*(long *)(lVar1 + (ulong)i * 0x68 + 0x50) != 0) break;
                      i = i + 1;
                    }
                  }
                  *(uint *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x10) = i;
                  if (((*(uint *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x18) & 0x10)
                       != 0) &&
                     (eindex = eindex + 1,
                     *(ulong *)(lVar1 + (ulong)i * 0x68 + 0x50) <= (ulong)(uint)eindex)) {
                    i = i + 1;
                    eindex = 0;
                  }
                }
                empty_streams = empty_streams + 1;
              } while( true );
            }
            iVar4 = parse_7zip_uint64((archive_read *)h_local,&ll);
            sVar3 = ll;
            if (iVar4 < 0) {
              return -1;
            }
            if (*(ulong *)(p + 0x70) < ll) {
              return -1;
            }
            switch(size_1._4_4_) {
            case 0xe:
              if (p_Stack_20->emptyStreamBools != (uchar *)0x0) {
                return -1;
              }
              puVar7 = (uchar *)calloc(*(size_t *)(p + 0x98),1);
              p_Stack_20->emptyStreamBools = puVar7;
              if (p_Stack_20->emptyStreamBools == (uchar *)0x0) {
                return -1;
              }
              iVar4 = read_Bools((archive_read *)h_local,p_Stack_20->emptyStreamBools,
                                 *(size_t *)(p + 0x98));
              if (iVar4 < 0) {
                return -1;
              }
              size._4_4_ = 0;
              for (empty_streams = 0; (ulong)(uint)empty_streams < *(ulong *)(p + 0x98);
                  empty_streams = empty_streams + 1) {
                if (p_Stack_20->emptyStreamBools[(uint)empty_streams] != '\0') {
                  size._4_4_ = size._4_4_ + 1;
                }
              }
              goto LAB_001b5bb4;
            case 0xf:
              if (size._4_4_ < 1) {
                puVar7 = header_bytes((archive_read *)h_local,ll);
                if (puVar7 == (uchar *)0x0) {
                  return -1;
                }
              }
              else {
                if (p_Stack_20->emptyFileBools != (uchar *)0x0) {
                  return -1;
                }
                puVar7 = (uchar *)calloc((long)size._4_4_,1);
                p_Stack_20->emptyFileBools = puVar7;
                if (p_Stack_20->emptyFileBools == (uchar *)0x0) {
                  return -1;
                }
                iVar4 = read_Bools((archive_read *)h_local,p_Stack_20->emptyFileBools,
                                   (long)size._4_4_);
                if (iVar4 < 0) {
                  return -1;
                }
              }
              goto LAB_001b5bb4;
            case 0x10:
              if (size._4_4_ < 1) {
                puVar7 = header_bytes((archive_read *)h_local,ll);
                if (puVar7 == (uchar *)0x0) {
                  return -1;
                }
              }
              else {
                if (p_Stack_20->antiBools != (uchar *)0x0) {
                  return -1;
                }
                puVar7 = (uchar *)calloc((long)size._4_4_,1);
                p_Stack_20->antiBools = puVar7;
                if (p_Stack_20->antiBools == (uchar *)0x0) {
                  return -1;
                }
                iVar4 = read_Bools((archive_read *)h_local,p_Stack_20->antiBools,(long)size._4_4_);
                if (iVar4 < 0) {
                  return -1;
                }
              }
              goto LAB_001b5bb4;
            case 0x11:
              folders = (_7z_folder *)header_bytes((archive_read *)h_local,1);
              if (folders == (_7z_folder *)0x0) {
                return -1;
              }
              nb = sVar3 - 1;
              if (((nb & 1) != 0) || (nb < (ulong)(*(long *)(p + 0x98) << 2))) {
                return -1;
              }
              if (*(long *)(p + 0xb0) != 0) {
                return -1;
              }
              pvVar6 = malloc(nb);
              *(void **)(p + 0xb0) = pvVar6;
              if (*(long *)(p + 0xb0) == 0) {
                return -1;
              }
              nl = *(size_t *)(p + 0xb0);
              for (b = nb; b != 0; b = b - _dir) {
                if (b < 0x10001) {
                  _dir = b;
                }
                else {
                  _dir = 0x10000;
                }
                folders = (_7z_folder *)header_bytes((archive_read *)h_local,_dir);
                if (folders == (_7z_folder *)0x0) {
                  return -1;
                }
                memcpy((void *)nl,folders,_dir);
                nl = _dir + nl;
              }
              nl = *(size_t *)(p + 0xb0);
              for (empty_streams = 0; (ulong)(uint)empty_streams < *(ulong *)(p + 0x98);
                  empty_streams = empty_streams + 1) {
                *(size_t *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 8) = nl;
                while( true ) {
                  bVar10 = false;
                  if ((1 < nb) && (bVar10 = true, *(char *)nl == '\0')) {
                    bVar10 = *(char *)(nl + 1) != '\0';
                  }
                  if (!bVar10) break;
                  nl = nl + 2;
                  nb = nb - 2;
                }
                if (nb < 2) {
                  return -1;
                }
                *(size_t *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50) =
                     nl - *(long *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 8);
                nl = nl + 2;
                nb = nb - 2;
              }
              goto LAB_001b5bb4;
            case 0x12:
            case 0x13:
            case 0x14:
              iVar4 = read_Times((archive_read *)h_local,p_Stack_20,size_1._4_4_);
              if (iVar4 < 0) {
                return -1;
              }
              goto LAB_001b5bb4;
            case 0x15:
              folders = (_7z_folder *)header_bytes((archive_read *)h_local,2);
              if (folders == (_7z_folder *)0x0) {
                return -1;
              }
              uVar2 = folders->numCoders;
              if (p_Stack_20->attrBools != (uchar *)0x0) {
                return -1;
              }
              puVar7 = (uchar *)calloc(*(size_t *)(p + 0x98),1);
              p_Stack_20->attrBools = puVar7;
              if (p_Stack_20->attrBools == (uchar *)0x0) {
                return -1;
              }
              if ((uchar)uVar2 == '\0') {
                iVar4 = read_Bools((archive_read *)h_local,p_Stack_20->attrBools,
                                   *(size_t *)(p + 0x98));
                if (iVar4 < 0) {
                  return -1;
                }
              }
              else {
                memset(p_Stack_20->attrBools,1,*(size_t *)(p + 0x98));
              }
              for (empty_streams = 0; (ulong)(uint)empty_streams < *(ulong *)(p + 0x98);
                  empty_streams = empty_streams + 1) {
                if (p_Stack_20->attrBools[(uint)empty_streams] != '\0') {
                  folders = (_7z_folder *)header_bytes((archive_read *)h_local,4);
                  if (folders == (_7z_folder *)0x0) {
                    return -1;
                  }
                  uVar5 = archive_le32dec(folders);
                  *(uint32_t *)(_indexInFolder + (ulong)(uint)empty_streams * 0x50 + 0x48) = uVar5;
                }
              }
              goto LAB_001b5bb4;
            case 0x19:
              if (ll == 0) goto LAB_001b5bb4;
            }
            puVar7 = header_bytes((archive_read *)h_local,ll);
          } while (puVar7 != (uchar *)0x0);
          a_local._4_4_ = -1;
        }
      }
      else {
        a_local._4_4_ = -1;
      }
    }
    else {
      a_local._4_4_ = -1;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
read_Header(struct archive_read *a, struct _7z_header_info *h,
    int check_header_id)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	struct _7z_folder *folders;
	struct _7z_stream_info *si = &(zip->si);
	struct _7zip_entry *entries;
	uint32_t folderIndex, indexInFolder;
	unsigned i;
	int eindex, empty_streams, sindex;

	if (check_header_id) {
		/*
		 * Read Header.
		 */
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		if (*p != kHeader)
			return (-1);
	}

	/*
	 * Read ArchiveProperties.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kArchiveProperties) {
		for (;;) {
			uint64_t size;
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			if (*p == 0)
				break;
			if (parse_7zip_uint64(a, &size) < 0)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 * Read MainStreamsInfo.
	 */
	if (*p == kMainStreamsInfo) {
		if (read_StreamsInfo(a, &(zip->si)) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kEnd)
		return (0);

	/*
	 * Read FilesInfo.
	 */
	if (*p != kFilesInfo)
		return (-1);

	if (parse_7zip_uint64(a, &(zip->numFiles)) < 0)
		return (-1);
	if (UMAX_ENTRY < zip->numFiles)
		return (-1);

	zip->entries = calloc((size_t)zip->numFiles, sizeof(*zip->entries));
	if (zip->entries == NULL)
		return (-1);
	entries = zip->entries;

	empty_streams = 0;
	for (;;) {
		int type;
		uint64_t size;
		size_t ll;

		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		type = *p;
		if (type == kEnd)
			break;

		if (parse_7zip_uint64(a, &size) < 0)
			return (-1);
		if (zip->header_bytes_remaining < size)
			return (-1);
		ll = (size_t)size;

		switch (type) {
		case kEmptyStream:
			if (h->emptyStreamBools != NULL)
				return (-1);
			h->emptyStreamBools = calloc((size_t)zip->numFiles,
			    sizeof(*h->emptyStreamBools));
			if (h->emptyStreamBools == NULL)
				return (-1);
			if (read_Bools(
			    a, h->emptyStreamBools, (size_t)zip->numFiles) < 0)
				return (-1);
			empty_streams = 0;
			for (i = 0; i < zip->numFiles; i++) {
				if (h->emptyStreamBools[i])
					empty_streams++;
			}
			break;
		case kEmptyFile:
			if (empty_streams <= 0) {
				/* Unexcepted sequence. Skip this. */
				if (header_bytes(a, ll) == NULL)
					return (-1);
				break;
			}
			if (h->emptyFileBools != NULL)
				return (-1);
			h->emptyFileBools = calloc(empty_streams,
			    sizeof(*h->emptyFileBools));
			if (h->emptyFileBools == NULL)
				return (-1);
			if (read_Bools(a, h->emptyFileBools, empty_streams) < 0)
				return (-1);
			break;
		case kAnti:
			if (empty_streams <= 0) {
				/* Unexcepted sequence. Skip this. */
				if (header_bytes(a, ll) == NULL)
					return (-1);
				break;
			}
			if (h->antiBools != NULL)
				return (-1);
			h->antiBools = calloc(empty_streams,
			    sizeof(*h->antiBools));
			if (h->antiBools == NULL)
				return (-1);
			if (read_Bools(a, h->antiBools, empty_streams) < 0)
				return (-1);
			break;
		case kCTime:
		case kATime:
		case kMTime:
			if (read_Times(a, h, type) < 0)
				return (-1);
			break;
		case kName:
		{
			unsigned char *np;
			size_t nl, nb;

			/* Skip one byte. */
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			ll--;

			if ((ll & 1) || ll < zip->numFiles * 4)
				return (-1);

			if (zip->entry_names != NULL)
				return (-1);
			zip->entry_names = malloc(ll);
			if (zip->entry_names == NULL)
				return (-1);
			np = zip->entry_names;
			nb = ll;
			/*
			 * Copy whole file names.
			 * NOTE: This loop prevents from expanding
			 * the uncompressed buffer in order not to
			 * use extra memory resource.
			 */
			while (nb) {
				size_t b;
				if (nb > UBUFF_SIZE)
					b = UBUFF_SIZE;
				else
					b = nb;
				if ((p = header_bytes(a, b)) == NULL)
					return (-1);
				memcpy(np, p, b);
				np += b;
				nb -= b;
			}
			np = zip->entry_names;
			nl = ll;

			for (i = 0; i < zip->numFiles; i++) {
				entries[i].utf16name = np;
#if defined(_WIN32) && !defined(__CYGWIN__) && defined(_DEBUG)
				entries[i].wname = (wchar_t *)np;
#endif

				/* Find a terminator. */
				while (nl >= 2 && (np[0] || np[1])) {
					np += 2;
					nl -= 2;
				}
				if (nl < 2)
					return (-1);/* Terminator not found */
				entries[i].name_len = np - entries[i].utf16name;
				np += 2;
				nl -= 2;
			}
			break;
		}
		case kAttributes:
		{
			int allAreDefined;

			if ((p = header_bytes(a, 2)) == NULL)
				return (-1);
			allAreDefined = *p;
			if (h->attrBools != NULL)
				return (-1);
			h->attrBools = calloc((size_t)zip->numFiles,
			    sizeof(*h->attrBools));
			if (h->attrBools == NULL)
				return (-1);
			if (allAreDefined)
				memset(h->attrBools, 1, (size_t)zip->numFiles);
			else {
				if (read_Bools(a, h->attrBools,
				      (size_t)zip->numFiles) < 0)
					return (-1);
			}
			for (i = 0; i < zip->numFiles; i++) {
				if (h->attrBools[i]) {
					if ((p = header_bytes(a, 4)) == NULL)
						return (-1);
					entries[i].attr = archive_le32dec(p);
				}
			}
			break;
		}
		case kDummy:
			if (ll == 0)
				break;
			__LA_FALLTHROUGH;
		default:
			if (header_bytes(a, ll) == NULL)
				return (-1);
			break;
		}
	}

	/*
	 * Set up entry's attributes.
	 */
	folders = si->ci.folders;
	eindex = sindex = 0;
	folderIndex = indexInFolder = 0;
	for (i = 0; i < zip->numFiles; i++) {
		if (h->emptyStreamBools == NULL || h->emptyStreamBools[i] == 0)
			entries[i].flg |= HAS_STREAM;
		/* The high 16 bits of attributes is a posix file mode. */
		entries[i].mode = entries[i].attr >> 16;

		if (!(entries[i].attr & FILE_ATTRIBUTE_UNIX_EXTENSION)) {
			// Only windows permissions specified for this entry. Translate to
			// reasonable corresponding unix permissions.

			if (entries[i].attr & FILE_ATTRIBUTE_DIRECTORY) {
				if (entries[i].attr & FILE_ATTRIBUTE_READONLY) {
					// Read-only directory.
					entries[i].mode = AE_IFDIR | 0555;
				} else {
					// Read-write directory.
					entries[i].mode = AE_IFDIR | 0755;
				}
			} else if (entries[i].attr & FILE_ATTRIBUTE_READONLY) {
				// Readonly file.
				entries[i].mode = AE_IFREG | 0444;
			} else {
				// Assume read-write file.
				entries[i].mode = AE_IFREG | 0644;
			}
		}

		if (entries[i].flg & HAS_STREAM) {
			if ((size_t)sindex >= si->ss.unpack_streams)
				return (-1);
			if (entries[i].mode == 0)
				entries[i].mode = AE_IFREG | 0666;
			if (si->ss.digestsDefined[sindex])
				entries[i].flg |= CRC32_IS_SET;
			entries[i].ssIndex = sindex;
			sindex++;
		} else {
			int dir;
			if (h->emptyFileBools == NULL)
				dir = 1;
			else {
				if (h->emptyFileBools[eindex])
					dir = 0;
				else
					dir = 1;
				eindex++;
			}
			if (entries[i].mode == 0) {
				if (dir)
					entries[i].mode = AE_IFDIR | 0777;
				else
					entries[i].mode = AE_IFREG | 0666;
			} else if (dir &&
			    (entries[i].mode & AE_IFMT) != AE_IFDIR) {
				entries[i].mode &= ~AE_IFMT;
				entries[i].mode |= AE_IFDIR;
			}
			if ((entries[i].mode & AE_IFMT) == AE_IFDIR &&
			    entries[i].name_len >= 2 &&
			    (entries[i].utf16name[entries[i].name_len-2] != '/' ||
			     entries[i].utf16name[entries[i].name_len-1] != 0)) {
				entries[i].utf16name[entries[i].name_len] = '/';
				entries[i].utf16name[entries[i].name_len+1] = 0;
				entries[i].name_len += 2;
			}
			entries[i].ssIndex = -1;
		}
		if (entries[i].attr & FILE_ATTRIBUTE_READONLY)
			entries[i].mode &= ~0222;/* Read only. */

		if ((entries[i].flg & HAS_STREAM) == 0 && indexInFolder == 0) {
			/*
			 * The entry is an empty file or a directory file,
			 * those both have no contents.
			 */
			entries[i].folderIndex = -1;
			continue;
		}
		if (indexInFolder == 0) {
			for (;;) {
				if (folderIndex >= si->ci.numFolders)
					return (-1);
				if (folders[folderIndex].numUnpackStreams)
					break;
				folderIndex++;
			}
		}
		entries[i].folderIndex = folderIndex;
		if ((entries[i].flg & HAS_STREAM) == 0)
			continue;
		indexInFolder++;
		if (indexInFolder >= folders[folderIndex].numUnpackStreams) {
			folderIndex++;
			indexInFolder = 0;
		}
	}

	return (0);
}